

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::Calc_Sxi_compact
          (ChElementBeamANCF_3243 *this,VectorN *Sxi_compact,double xi,double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = xi;
  auVar3 = auVar4._0_16_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = xi * xi;
  auVar1 = vfmsub231sd_fma(auVar5,auVar3,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = xi * xi;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = xi * 3.0;
  auVar5 = vfmsub213sd_fma(auVar3,auVar6,auVar2);
  auVar2 = vfnmadd231sd_fma(auVar2,auVar6,auVar3);
  auVar6 = vfmadd231sd_fma(auVar6,auVar3,auVar6);
  auVar2 = vunpcklpd_avx(auVar3,auVar2);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [0] = (auVar5._0_8_ + 2.0) * 0.25;
  auVar5 = vsubpd_avx(ZEXT816(0x3ff0000000000000),auVar2);
  auVar3._8_8_ = 0x4000000000000000;
  auVar3._0_8_ = 0x4000000000000000;
  auVar2 = vaddpd_avx512vl(auVar2,auVar3);
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [1] = ((auVar1._0_8_ - xi) + 1.0) * this->m_lenX * 0.125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [2] = auVar5._0_8_ * this->m_thicknessY * 0.25 * eta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [3] = auVar5._0_8_ * this->m_thicknessZ * 0.25 * zeta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [4] = auVar2._8_8_ * 0.25;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [5] = ((auVar6._0_8_ - xi) + -1.0) * this->m_lenX * 0.125;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [6] = (xi + 1.0) * this->m_thicknessY * 0.25 * eta;
  (Sxi_compact->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array
  [7] = (xi + 1.0) * this->m_thicknessZ * 0.25 * zeta;
  return;
}

Assistant:

void ChElementBeamANCF_3243::Calc_Sxi_compact(VectorN& Sxi_compact, double xi, double eta, double zeta) {
    Sxi_compact(0) = 0.25 * (xi * xi * xi - 3 * xi + 2);
    Sxi_compact(1) = 0.125 * m_lenX * (xi * xi * xi - xi * xi - xi + 1);
    Sxi_compact(2) = 0.25 * m_thicknessY * eta * (1 - xi);
    Sxi_compact(3) = 0.25 * m_thicknessZ * zeta * (1 - xi);
    Sxi_compact(4) = 0.25 * (-xi * xi * xi + 3 * xi + 2);
    Sxi_compact(5) = 0.125 * m_lenX * (xi * xi * xi + xi * xi - xi - 1);
    Sxi_compact(6) = 0.25 * m_thicknessY * eta * (1 + xi);
    Sxi_compact(7) = 0.25 * m_thicknessZ * zeta * (1 + xi);
}